

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::cbtArcArcCollisionAlgorithm::processCollision
          (cbtArcArcCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar4;
  cbtCollisionObject *pcVar5;
  cbtCollisionShape *pcVar6;
  cbtCollisionShape *pcVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar25;
  cbtCollisionObjectWrapper *pcVar26;
  cbtTransform *this_01;
  byte bVar27;
  byte bVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  cbtScalar cVar32;
  float fVar33;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar34;
  undefined1 auVar55 [56];
  undefined1 auVar41 [64];
  undefined8 uVar54;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar37 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [56];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  double dVar65;
  uint uVar66;
  double dVar67;
  float fVar68;
  undefined4 in_XMM5_Db;
  undefined8 in_XMM5_Qb;
  cbtVector3 cVar69;
  cbtVector3 cVar70;
  cbtScalar len;
  cbtVector3 local_rese8;
  cbtVector3 normal_on_2;
  cbtVector3 pos2;
  undefined1 local_168 [16];
  float local_118;
  float fStack_114;
  cbtScalar local_fc;
  undefined1 local_f8 [16];
  cbtVector3 local_e8;
  double local_d8;
  undefined8 uStack_d0;
  cbtVector3 local_c8;
  ulong local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  cbtMatrix3x3 local_80;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  
  this_00 = this->m_manifoldPtr;
  if (this_00 == (cbtPersistentManifold *)0x0) {
    return;
  }
  bVar3 = this->m_isSwapped;
  resultOut->m_manifoldPtr = this_00;
  pcVar26 = body1;
  if (bVar3 != false) {
    pcVar26 = body0;
    body0 = body1;
  }
  cbtPersistentManifold::clearManifold(this_00);
  pcVar4 = body0->m_collisionObject;
  pcVar5 = pcVar26->m_collisionObject;
  auVar29 = vfmadd231ss_fma(ZEXT416((uint)((pcVar4->m_worldTransform).m_basis.m_el[1].m_floats[2] *
                                          (pcVar5->m_worldTransform).m_basis.m_el[1].m_floats[2])),
                            ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[0].m_floats[2]),
                            ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[0].m_floats[2]));
  auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[2].
                                                  m_floats[2]),
                            ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[2].m_floats[2]));
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx512vl(auVar29,auVar12);
  auVar64 = ZEXT856(0);
  if (auVar29._0_4_ < 0.99) {
    return;
  }
  pcVar6 = body0->m_shape;
  pcVar7 = pcVar26->m_shape;
  this_01 = &pcVar5->m_worldTransform;
  cVar69 = cbtTransform::invXform(this_01,&(pcVar4->m_worldTransform).m_origin);
  auVar59._0_8_ = cVar69.m_floats._8_8_;
  auVar59._8_56_ = auVar64;
  auVar29._8_4_ = 0x7fffffff;
  auVar29._0_8_ = 0x7fffffff7fffffff;
  auVar29._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx512vl(auVar59._0_16_,auVar29);
  auVar64 = (undefined1  [56])0x0;
  if (*(float *)&pcVar6[2].field_0x1c + *(float *)&pcVar7[2].field_0x1c < auVar29._0_4_) {
    return;
  }
  auVar55 = ZEXT856(0);
  local_e8.m_floats[2] = 0.0;
  local_e8.m_floats[3] = 0.0;
  local_e8.m_floats._0_8_ = *(ulong *)((long)&pcVar6[2]._vptr_cbtCollisionShape + 4);
  cVar69 = cbtTransform::operator()(&pcVar4->m_worldTransform,&local_e8);
  auVar60._0_8_ = cVar69.m_floats._8_8_;
  auVar60._8_56_ = auVar64;
  auVar41._0_8_ = cVar69.m_floats._0_8_;
  auVar41._8_56_ = auVar55;
  local_80.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar41._0_16_,auVar60._0_16_);
  uVar54 = local_80.m_el[0].m_floats._8_8_;
  cVar69 = cbtTransform::invXform(this_01,local_80.m_el);
  local_f8._8_8_ = uVar54;
  local_f8._0_8_ = cVar69.m_floats._0_8_;
  cbtMatrix3x3::transpose(&local_80,&this_01->m_basis);
  auVar55 = (undefined1  [56])0x0;
  local_c8.m_floats = SUB6416(ZEXT464(0x3f800000),0);
  cVar70 = ::operator*(&(pcVar4->m_worldTransform).m_basis,&local_c8);
  auVar61._0_8_ = cVar70.m_floats._8_8_;
  auVar61._8_56_ = auVar64;
  auVar42._0_8_ = cVar70.m_floats._0_8_;
  auVar42._8_56_ = auVar55;
  local_e8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar42._0_16_,auVar61._0_16_);
  auVar64 = ZEXT856(local_e8.m_floats._8_8_);
  cVar70 = ::operator*(&local_80,&local_e8);
  auVar43._0_8_ = cVar70.m_floats._0_8_;
  auVar43._8_56_ = auVar64;
  auVar29 = vmovshdup_avx(auVar43._0_16_);
  fVar30 = atan2f(auVar29._0_4_,cVar70.m_floats[0]);
  local_98 = (double)*(float *)&pcVar6[2].m_userPointer;
  uVar2 = *(ulong *)((long)&pcVar7[2]._vptr_cbtCollisionShape + 4);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar2;
  local_a8 = (double)*(float *)((long)&pcVar6[2].m_userPointer + 4);
  fVar33 = *(float *)&pcVar7[2].m_userPointer;
  local_d8 = (double)*(float *)((long)&pcVar7[2].m_userPointer + 4);
  auVar29 = vsubps_avx(local_f8,auVar56);
  local_168._0_4_ = cVar69.m_floats[2];
  local_80.m_el[0].m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar29,ZEXT416((uint)local_168._0_4_),0x28);
  local_fc = cbtVector3::length(local_80.m_el);
  local_168._8_8_ = 0;
  if (local_fc < 1e-08) {
    return;
  }
  uVar54 = extraout_XMM0_Qb;
  cVar69 = ::operator/(local_80.m_el,&local_fc);
  local_168._0_8_ = cVar69.m_floats._8_8_;
  local_b8 = cVar69.m_floats._0_8_;
  uStack_b0 = uVar54;
  fVar31 = atan2f(local_80.m_el[0].m_floats[1],local_80.m_el[0].m_floats[0]);
  bVar27 = (byte)pcVar6[2].m_userIndex;
  dVar65 = (double)fVar31;
  fVar31 = cVar69.m_floats[2];
  local_118 = (float)uVar2;
  fStack_114 = (float)(uVar2 >> 0x20);
  if ((bVar27 == 0) && ((char)pcVar7[2].m_userIndex == '\0')) {
    fVar1 = *(float *)&pcVar7[2].field_0xc;
    auVar24._8_8_ = uStack_b0;
    auVar24._0_8_ = local_b8;
    auVar35._0_4_ = (float)local_b8 * fVar1 + local_118;
    auVar35._4_4_ = (float)(local_b8 >> 0x20) * fVar1 + fStack_114;
    auVar35._8_4_ = (float)uStack_b0 * fVar1 + 0.0;
    auVar35._12_4_ = (float)((ulong)uStack_b0 >> 0x20) * fVar1 + 0.0;
    local_e8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar35,ZEXT416((uint)(fVar31 * fVar1 + 0.0)),0x28);
    local_c8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24,local_168);
    cVar32 = cbtVector3::length(local_80.m_el);
    bVar27 = (byte)pcVar6[2].m_userIndex;
    bVar3 = true;
    dVar67 = dVar65 + 3.141592653589793;
    local_f8._0_8_ =
         (undefined8)((cVar32 - *(float *)&pcVar6[2].field_0xc) - *(float *)&pcVar7[2].field_0xc);
    local_f8._8_8_ = 0;
    dVar34 = dVar65;
  }
  else {
    bVar3 = false;
    dVar67 = 0.0;
    local_f8._0_12_ = ZEXT812(0);
    local_f8._12_4_ = 0;
    dVar34 = 0.0;
  }
  uVar66 = (uint)((ulong)local_168._8_8_ >> 0x20);
  if ((((bVar27 & 1) == 0) && ((char)pcVar7[2].m_userIndex == '\x01')) &&
     (fVar1 = *(float *)&pcVar7[2].field_0xc, *(float *)&pcVar6[2].field_0xc <= fVar1)) {
    fVar68 = (float)((ulong)uStack_b0 >> 0x20);
    auVar36._0_4_ = (float)local_b8 * fVar1 + local_118;
    auVar36._4_4_ = (float)(local_b8 >> 0x20) * fVar1 + fStack_114;
    auVar36._8_4_ = (float)uStack_b0 * fVar1 + 0.0;
    auVar36._12_4_ = fVar68 * fVar1 + 0.0;
    local_e8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar36,ZEXT416((uint)(fVar31 * fVar1 + 0.0)),0x28);
    auVar37._0_8_ = local_b8 ^ 0x8000000080000000;
    auVar37._8_4_ = -(float)uStack_b0;
    auVar37._12_4_ = -fVar68;
    auVar57._0_8_ = local_168._0_8_ ^ 0x8000000080000000;
    auVar57._8_4_ = (uint)local_168._8_8_ ^ 0x80000000;
    auVar57._12_4_ = uVar66 ^ 0x80000000;
    local_c8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar37,auVar57,0x28);
    auVar44._0_4_ = cbtVector3::length(local_80.m_el);
    auVar44._4_60_ = extraout_var;
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar29 = vxorps_avx512vl(auVar44._0_16_,auVar13);
    bVar27 = (byte)pcVar6[2].m_userIndex;
    bVar3 = true;
    local_f8._8_8_ = 0;
    local_f8._0_8_ =
         (double)((auVar29._0_4_ - *(float *)&pcVar6[2].field_0xc) + *(float *)&pcVar7[2].field_0xc)
    ;
    dVar67 = dVar65;
    dVar34 = dVar65;
  }
  if ((((bVar27 & 1) == 0) || ((char)pcVar7[2].m_userIndex != '\0')) ||
     (fVar1 = *(float *)&pcVar7[2].field_0xc, *(float *)&pcVar6[2].field_0xc < fVar1)) {
    if (!bVar3) {
      return;
    }
  }
  else {
    auVar38._0_4_ = (float)local_b8 * fVar1;
    auVar38._4_4_ = (float)(local_b8 >> 0x20) * fVar1;
    auVar38._8_4_ = (float)uStack_b0 * fVar1;
    fVar68 = (float)((ulong)uStack_b0 >> 0x20);
    auVar38._12_4_ = fVar68 * fVar1;
    auVar29 = vsubps_avx(auVar56,auVar38);
    local_e8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar29,ZEXT416((uint)(0.0 - fVar31 * fVar1)),0x28);
    auVar58._0_8_ = local_b8 ^ 0x8000000080000000;
    auVar58._8_4_ = -(float)uStack_b0;
    auVar58._12_4_ = -fVar68;
    auVar39._0_8_ = local_168._0_8_ ^ 0x8000000080000000;
    auVar39._8_4_ = (uint)local_168._8_8_ ^ 0x80000000;
    auVar39._12_4_ = uVar66 ^ 0x80000000;
    local_c8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar58,auVar39,0x28);
    cVar32 = cbtVector3::length(local_80.m_el);
    dVar67 = dVar65 + 3.141592653589793;
    local_f8._8_8_ = 0;
    local_f8._0_8_ =
         (double)((*(float *)&pcVar6[2].field_0xc - cVar32) - *(float *)&pcVar7[2].field_0xc);
    dVar34 = dVar67;
  }
  dVar65 = (double)fVar30 + local_a8;
  auVar45._0_8_ = fmod((double)fVar30 + local_98,6.283185307179586);
  auVar45._8_56_ = extraout_var_00;
  uVar54 = vcmpsd_avx512f(auVar45._0_16_,ZEXT816(0) << 0x40,1);
  bVar3 = (bool)((byte)uVar54 & 1);
  auVar46._0_8_ = fmod(dVar65,6.283185307179586);
  auVar46._8_56_ = extraout_var_01;
  uVar54 = vcmpsd_avx512f(auVar46._0_16_,ZEXT816(0),1);
  bVar9 = (bool)((byte)uVar54 & 1);
  auVar47._0_8_ = fmod((double)fVar33,6.283185307179586);
  auVar47._8_56_ = extraout_var_02;
  uVar54 = vcmpsd_avx512f(auVar47._0_16_,ZEXT816(0),1);
  bVar10 = (bool)((byte)uVar54 & 1);
  auVar48._0_8_ = fmod(local_d8,6.283185307179586);
  auVar48._8_56_ = extraout_var_03;
  uVar54 = vcmpsd_avx512f(auVar48._0_16_,ZEXT816(0),1);
  bVar11 = (bool)((byte)uVar54 & 1);
  local_98 = (double)((ulong)bVar11 * (long)(auVar48._0_8_ + 6.283185307179586) +
                     (ulong)!bVar11 * (long)auVar48._0_8_);
  uStack_90 = extraout_var_03._0_8_;
  auVar49._0_8_ = fmod(dVar67,6.283185307179586);
  auVar49._8_56_ = extraout_var_04;
  uVar54 = vcmpsd_avx512f(auVar49._0_16_,ZEXT816(0),1);
  bVar11 = (bool)((byte)uVar54 & 1);
  local_a8 = (double)((ulong)bVar11 * (long)(auVar49._0_8_ + 6.283185307179586) +
                     (ulong)!bVar11 * (long)auVar49._0_8_);
  uStack_a0 = extraout_var_04._0_8_;
  auVar50._0_8_ = fmod(dVar34,6.283185307179586);
  auVar50._8_56_ = extraout_var_05;
  uVar54 = vcmpsd_avx512f(auVar50._0_16_,ZEXT816(0),1);
  bVar11 = (bool)((byte)uVar54 & 1);
  local_d8 = fmod((double)((ulong)bVar3 * (long)(auVar45._0_8_ + 6.283185307179586) +
                          (ulong)!bVar3 * (long)auVar45._0_8_),6.283185307179586);
  uStack_d0 = extraout_XMM0_Qb_00;
  dVar65 = fmod((double)((ulong)bVar9 * (long)(auVar46._0_8_ + 6.283185307179586) +
                        (ulong)!bVar9 * (long)auVar46._0_8_),6.283185307179586);
  local_168._0_8_ =
       fmod((double)((ulong)bVar10 * (long)(auVar47._0_8_ + 6.283185307179586) +
                    (ulong)!bVar10 * (long)auVar47._0_8_),6.283185307179586);
  local_168._8_8_ = extraout_XMM0_Qb_02;
  dVar67 = fmod(local_98,6.283185307179586);
  dVar34 = fmod(local_a8,6.283185307179586);
  auVar51._0_8_ =
       fmod((double)((ulong)bVar11 * (long)(auVar50._0_8_ + 6.283185307179586) +
                    (ulong)!bVar11 * (long)auVar50._0_8_),6.283185307179586);
  auVar51._8_56_ = extraout_var_06;
  if ((char)pcVar6[2].m_userIndex == '\x01') {
    auVar22._8_8_ = uStack_d0;
    auVar22._0_8_ = local_d8;
    auVar16._8_8_ = extraout_XMM0_Qb_01;
    auVar16._0_8_ = dVar65;
    if (dVar65 <= local_d8) {
      auVar20._8_8_ = extraout_XMM0_Qb_04;
      auVar20._0_8_ = dVar34;
      uVar54 = vcmppd_avx512vl(auVar20,auVar16,2);
      bVar27 = (byte)uVar54;
      uVar54 = vcmppd_avx512vl(auVar22,auVar20,2);
      bVar28 = (byte)uVar54;
LAB_00d402a1:
      bVar27 = bVar28 & 3 | bVar27 & 3;
    }
    else {
      auVar18._8_8_ = extraout_XMM0_Qb_04;
      auVar18._0_8_ = dVar34;
      uVar54 = vcmppd_avx512vl(auVar22,auVar18,2);
      uVar8 = vcmppd_avx512vl(auVar18,auVar16,2);
      bVar27 = (byte)uVar54 & 3 & (byte)uVar8;
    }
  }
  else {
    auVar23._8_8_ = uStack_d0;
    auVar23._0_8_ = local_d8;
    auVar17._8_8_ = extraout_XMM0_Qb_01;
    auVar17._0_8_ = dVar65;
    if (local_d8 < dVar65) {
      auVar19._8_8_ = extraout_XMM0_Qb_04;
      auVar19._0_8_ = dVar34;
      uVar54 = vcmppd_avx512vl(auVar19,auVar23,2);
      bVar27 = (byte)uVar54;
      uVar54 = vcmppd_avx512vl(auVar17,auVar19,2);
      bVar28 = (byte)uVar54;
      goto LAB_00d402a1;
    }
    auVar21._8_8_ = extraout_XMM0_Qb_04;
    auVar21._0_8_ = dVar34;
    uVar54 = vcmppd_avx512vl(auVar17,auVar21,2);
    uVar8 = vcmppd_avx512vl(auVar21,auVar23,2);
    bVar27 = (byte)uVar54 & 3 & (byte)uVar8;
  }
  auVar64 = ZEXT856(extraout_XMM0_Qb_02);
  auVar15._8_8_ = extraout_XMM0_Qb_03;
  auVar15._0_8_ = dVar67;
  auVar29 = auVar51._0_16_;
  if ((char)pcVar7[2].m_userIndex == '\x01') {
    if ((double)local_168._0_8_ < dVar67) {
      uVar54 = vcmppd_avx512vl(local_168,auVar29,2);
      uVar8 = vcmppd_avx512vl(auVar29,auVar15,2);
      bVar28 = (byte)uVar54 & 3 & (byte)uVar8;
      goto LAB_00d4031f;
    }
    uVar54 = vcmppd_avx512vl(auVar29,auVar15,2);
    bVar28 = (byte)uVar54;
    uVar54 = vcmppd_avx512vl(local_168,auVar29,2);
    bVar25 = (byte)uVar54;
  }
  else {
    if (dVar67 <= (double)local_168._0_8_) {
      uVar54 = vcmppd_avx512vl(auVar15,auVar29,2);
      uVar8 = vcmppd_avx512vl(auVar29,local_168,2);
      bVar28 = (byte)uVar54 & 3 & (byte)uVar8;
      goto LAB_00d4031f;
    }
    uVar54 = vcmppd_avx512vl(auVar29,local_168,2);
    bVar28 = (byte)uVar54;
    uVar54 = vcmppd_avx512vl(auVar15,auVar29,2);
    bVar25 = (byte)uVar54;
  }
  bVar28 = bVar25 & 3 | bVar28 & 3;
LAB_00d4031f:
  if ((bVar27 & bVar28 & 1) != 0) {
    auVar55 = extraout_var_06;
    cVar69 = cbtTransform::operator()(this_01,&local_e8);
    auVar62._0_8_ = cVar69.m_floats._8_8_;
    auVar62._8_56_ = auVar64;
    auVar52._0_8_ = cVar69.m_floats._0_8_;
    auVar52._8_56_ = auVar55;
    local_40 = vunpcklpd_avx(auVar52._0_16_,auVar62._0_16_);
    auVar55 = ZEXT856(local_40._8_8_);
    cVar69 = ::operator*(&this_01->m_basis,&local_c8);
    auVar63._0_8_ = cVar69.m_floats._8_8_;
    auVar63._8_56_ = auVar64;
    auVar53._0_8_ = cVar69.m_floats._0_8_;
    auVar53._8_56_ = auVar55;
    local_50 = vunpcklpd_avx(auVar53._0_16_,auVar63._0_16_);
    auVar14._8_4_ = 0xffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar29 = vandpd_avx512vl(local_f8,auVar14);
    fVar30 = auVar29._0_4_;
    (*pcVar6->_vptr_cbtCollisionShape[0xc])(pcVar6);
    fVar33 = fVar30;
    (*pcVar7->_vptr_cbtCollisionShape[0xc])(pcVar7);
    local_168._0_8_ = auVar29._0_8_;
    if ((double)local_168._0_8_ <= (double)(fVar33 + fVar30)) {
      auVar40._0_4_ = (float)(double)local_f8._0_8_;
      auVar40._8_8_ = in_XMM5_Qb;
      auVar40._4_4_ = in_XMM5_Db;
      (*(resultOut->super_Result)._vptr_Result[4])(auVar40._0_8_,resultOut,local_50,local_40);
      cbtManifoldResult::refreshContactPoints(resultOut);
    }
  }
  return;
}

Assistant:

void cbtArcArcCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                   const cbtCollisionObjectWrapper* body1,
                                                   const cbtDispatcherInfo& dispatchInfo,
                                                   cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* arcObj1Wrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* arcObj2Wrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    // only 1 contact per pair, avoid persistence
    resultOut->getPersistentManifold()->clearManifold();

    const cbt2DarcShape* arc1 = (cbt2DarcShape*)arcObj1Wrap->getCollisionShape();
    const cbt2DarcShape* arc2 = (cbt2DarcShape*)arcObj2Wrap->getCollisionShape();

    const cbtTransform& m44Tarc1 = arcObj1Wrap->getCollisionObject()->getWorldTransform();
    const cbtTransform& m44Tarc2 = arcObj2Wrap->getCollisionObject()->getWorldTransform();

    // Shapes on two planes that are not so parallel? no collisions!
    cbtVector3 Zarc1 = m44Tarc1.getBasis().getColumn(2);
    cbtVector3 Zarc2 = m44Tarc2.getBasis().getColumn(2);
    if (fabs(Zarc1.dot(Zarc2)) < 0.99)  //***TODO*** threshold as setting
        return;

    // Shapes on two planes that are too far? no collisions!
    cbtVector3 diff = m44Tarc2.invXform(m44Tarc1.getOrigin());
    if (fabs(diff.getZ()) > (arc1->get_zthickness() + arc2->get_zthickness()))
        return;

    // vectors and angles of arc 1 in arc 2 csys:
    cbtVector3 local_arc1_center = m44Tarc2.invXform(m44Tarc1 * cbtVector3(arc1->get_X(), arc1->get_Y(), 0));
    cbtVector3 local_arc1_X = m44Tarc2.getBasis().transpose() * (m44Tarc1.getBasis() * cbtVector3(1, 0, 0));
    double local_arc1_rot = atan2(local_arc1_X.getY(), local_arc1_X.getX());
    double arc1_angle1 = local_arc1_rot + arc1->get_angle1();
    double arc1_angle2 = local_arc1_rot + arc1->get_angle2();

    cbtVector3 local_arc2_center = cbtVector3(arc2->get_X(), arc2->get_Y(), 0);
    double arc2_angle1 = arc2->get_angle1();
    double arc2_angle2 = arc2->get_angle2();

    cbtVector3 local_C1C2 = local_arc1_center - local_arc2_center;
    auto len = local_C1C2.length();
    if (len < 1e-8)
        return;
    cbtVector3 local_D12 = local_C1C2 / len;

    cbtVector3 local_P1;
    cbtVector3 local_P2;
    cbtVector3 local_N2;
    double dist = 0;
    bool paired = false;
    double alpha = atan2(local_C1C2.getY(), local_C1C2.getX());
    double alpha1 = 0, alpha2 = 0;

    // convex-convex
    if (arc1->get_counterclock() == false && arc2->get_counterclock() == false) {
        local_P1 = local_arc1_center - local_D12 * arc1->get_radius();
        local_P2 = local_arc2_center + local_D12 * arc2->get_radius();
        local_N2 = local_D12;
        dist = local_C1C2.length() - arc1->get_radius() - arc2->get_radius();
        alpha1 = alpha + CH_C_PI;
        alpha2 = alpha;
        paired = true;
    }
    // convex-concave
    if (arc1->get_counterclock() == false && arc2->get_counterclock() == true)
        if (arc1->get_radius() <= arc2->get_radius()) {
            local_P1 = local_arc1_center + local_D12 * arc1->get_radius();
            local_P2 = local_arc2_center + local_D12 * arc2->get_radius();
            local_N2 = -local_D12;
            dist = -local_C1C2.length() - arc1->get_radius() + arc2->get_radius();
            alpha1 = alpha;
            alpha2 = alpha;
            paired = true;
        }
    // concave-convex
    if (arc1->get_counterclock() == true && arc2->get_counterclock() == false)
        if (arc1->get_radius() >= arc2->get_radius()) {
            local_P1 = local_arc1_center - local_D12 * arc1->get_radius();
            local_P2 = local_arc2_center - local_D12 * arc2->get_radius();
            local_N2 = -local_D12;
            dist = -local_C1C2.length() + arc1->get_radius() - arc2->get_radius();
            alpha1 = alpha + CH_C_PI;
            alpha2 = alpha + CH_C_PI;
            paired = true;
        }

    if (!paired)
        return;

    // Discard points out of min-max angles

    // to always positive angles:
    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    if (arc1_angle1 < 0)
        arc1_angle1 += CH_C_2PI;
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);
    if (arc1_angle2 < 0)
        arc1_angle2 += CH_C_2PI;
    arc2_angle1 = fmod(arc2_angle1, CH_C_2PI);
    if (arc2_angle1 < 0)
        arc2_angle1 += CH_C_2PI;
    arc2_angle2 = fmod(arc2_angle2, CH_C_2PI);
    if (arc2_angle2 < 0)
        arc2_angle2 += CH_C_2PI;
    alpha1 = fmod(alpha1, CH_C_2PI);
    if (alpha1 < 0)
        alpha1 += CH_C_2PI;
    alpha2 = fmod(alpha2, CH_C_2PI);
    if (alpha2 < 0)
        alpha2 += CH_C_2PI;

    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);
    arc2_angle1 = fmod(arc2_angle1, CH_C_2PI);
    arc2_angle2 = fmod(arc2_angle2, CH_C_2PI);
    alpha1 = fmod(alpha1, CH_C_2PI);
    alpha2 = fmod(alpha2, CH_C_2PI);

    bool inangle1 = false;
    bool inangle2 = false;

    if (arc1->get_counterclock() == true) {
        if (arc1_angle1 < arc1_angle2) {
            if (alpha1 >= arc1_angle1 && alpha1 <= arc1_angle2)
                inangle1 = true;
        } else {
            if (alpha1 >= arc1_angle1 || alpha1 <= arc1_angle2)
                inangle1 = true;
        }
    } else {
        if (arc1_angle1 < arc1_angle2) {
            if (alpha1 >= arc1_angle2 || alpha1 <= arc1_angle1)
                inangle1 = true;
        } else {
            if (alpha1 >= arc1_angle2 && alpha1 <= arc1_angle1)
                inangle1 = true;
        }
    }

    if (arc2->get_counterclock() == true) {
        if (arc2_angle1 < arc2_angle2) {
            if (alpha2 >= arc2_angle1 && alpha2 <= arc2_angle2)
                inangle2 = true;
        } else {
            if (alpha2 >= arc2_angle1 || alpha2 <= arc2_angle2)
                inangle2 = true;
        }
    } else {
        if (arc2_angle1 < arc2_angle2) {
            if (alpha2 >= arc2_angle2 || alpha2 <= arc2_angle1)
                inangle2 = true;
        } else {
            if (alpha2 >= arc2_angle2 && alpha2 <= arc2_angle1)
                inangle2 = true;
        }
    }

    if (!(inangle1 && inangle2))
        return;

    // transform in absolute coords:
    cbtVector3 pos2 = m44Tarc2 * local_P2;
    cbtVector3 normal_on_2 = m44Tarc2.getBasis() * local_N2;

    // too far or too interpenetrate? discard.
    if (fabs(dist) > (arc1->getMargin() + arc2->getMargin()))
        return;

    /// report a contact.
    resultOut->addContactPoint(normal_on_2, pos2, (cbtScalar)dist);

    resultOut->refreshContactPoints();
}